

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool op_s_rrr_shr(DisasContext_conflict1 *s,arg_s_rrr_shr *a,
                  _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_conflict1 *gen,int logic_cc,
                  StoreRegKind kind)

{
  int iVar1;
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *pTVar2;
  _Bool _Var3;
  TCGTemp *pTVar4;
  TCGTemp *pTVar5;
  uintptr_t o_2;
  TCGv_i32 var;
  TCGContext_conflict1 *tcg_ctx;
  uintptr_t o;
  TCGv_i32 var_00;
  
  s_00 = s->uc->tcg_ctx;
  iVar1 = a->rs;
  pTVar4 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
  load_reg_var(s,(TCGv_i32)((long)pTVar4 - (long)s_00),iVar1);
  iVar1 = a->rm;
  pTVar2 = s->uc->tcg_ctx;
  pTVar5 = tcg_temp_new_internal_aarch64(pTVar2,TCG_TYPE_I32,false);
  var_00 = (TCGv_i32)((long)pTVar5 - (long)pTVar2);
  load_reg_var(s,var_00,iVar1);
  gen_arm_shift_reg(s_00,var_00,a->shty,(TCGv_i32)((long)pTVar4 - (long)s_00),logic_cc);
  iVar1 = a->rn;
  pTVar2 = s->uc->tcg_ctx;
  pTVar4 = tcg_temp_new_internal_aarch64(pTVar2,TCG_TYPE_I32,false);
  var = (TCGv_i32)((long)pTVar4 - (long)pTVar2);
  load_reg_var(s,var,iVar1);
  (*gen)(s_00,var,var,var_00);
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(var_00 + (long)s_00));
  if (logic_cc != 0) {
    if (s_00->cpu_NF != var) {
      tcg_gen_op2_aarch64(s_00,INDEX_op_mov_i32,(TCGArg)(s_00->cpu_NF + (long)s_00),
                          (TCGArg)((long)s_00 + (long)var));
    }
    if (s_00->cpu_ZF != var) {
      tcg_gen_op2_aarch64(s_00,INDEX_op_mov_i32,(TCGArg)(s_00->cpu_ZF + (long)s_00),
                          (TCGArg)((long)s_00 + (long)var));
    }
  }
  _Var3 = store_reg_kind(s,a->rd,var,kind);
  return _Var3;
}

Assistant:

static bool op_s_rrr_shr(DisasContext *s, arg_s_rrr_shr *a,
                         void (*gen)(TCGContext *, TCGv_i32, TCGv_i32, TCGv_i32),
                         int logic_cc, StoreRegKind kind)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp1, tmp2;

    tmp1 = load_reg(s, a->rs);
    tmp2 = load_reg(s, a->rm);
    gen_arm_shift_reg(tcg_ctx, tmp2, a->shty, tmp1, logic_cc);
    tmp1 = load_reg(s, a->rn);

    gen(tcg_ctx, tmp1, tmp1, tmp2);
    tcg_temp_free_i32(tcg_ctx, tmp2);

    if (logic_cc) {
        gen_logic_CC(tcg_ctx, tmp1);
    }
    return store_reg_kind(s, a->rd, tmp1, kind);
}